

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

UChar * __thiscall
icu_63::UnicodeStringAppendable::getAppendBuffer
          (UnicodeStringAppendable *this,int32_t minCapacity,int32_t desiredCapacityHint,
          UChar *scratch,int32_t scratchCapacity,int32_t *resultCapacity)

{
  short sVar1;
  UnicodeString *pUVar2;
  UBool UVar3;
  char16_t *pcVar4;
  int iVar5;
  int32_t iVar6;
  
  if (minCapacity < 1 || scratchCapacity < minCapacity) {
    *resultCapacity = 0;
    scratch = (UChar *)0x0;
  }
  else {
    pUVar2 = this->str;
    sVar1 = (pUVar2->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar6 = (pUVar2->fUnion).fFields.fLength;
    }
    else {
      iVar6 = (int)sVar1 >> 5;
    }
    if ((desiredCapacityHint <= 0x7ffffff5 - iVar6 && minCapacity <= 0x7ffffff5 - iVar6) &&
       (UVar3 = UnicodeString::cloneArrayIfNeeded
                          (pUVar2,minCapacity + iVar6,desiredCapacityHint + iVar6,'\x01',
                           (int32_t **)0x0,'\0'), UVar3 != '\0')) {
      pUVar2 = this->str;
      if (((pUVar2->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
        iVar5 = (pUVar2->fUnion).fFields.fCapacity;
      }
      else {
        iVar5 = 0x1b;
      }
      *resultCapacity = iVar5 - iVar6;
      if ((undefined1  [56])((undefined1  [56])pUVar2->fUnion & (undefined1  [56])0x2) ==
          (undefined1  [56])0x0) {
        pcVar4 = (pUVar2->fUnion).fFields.fArray;
      }
      else {
        pcVar4 = (char16_t *)((long)&pUVar2->fUnion + 2);
      }
      return pcVar4 + iVar6;
    }
    *resultCapacity = scratchCapacity;
  }
  return scratch;
}

Assistant:

UChar *
UnicodeStringAppendable::getAppendBuffer(int32_t minCapacity,
                                         int32_t desiredCapacityHint,
                                         UChar *scratch, int32_t scratchCapacity,
                                         int32_t *resultCapacity) {
  if(minCapacity < 1 || scratchCapacity < minCapacity) {
    *resultCapacity = 0;
    return NULL;
  }
  int32_t oldLength = str.length();
  if(minCapacity <= (kMaxCapacity - oldLength) &&
      desiredCapacityHint <= (kMaxCapacity - oldLength) &&
      str.cloneArrayIfNeeded(oldLength + minCapacity, oldLength + desiredCapacityHint)) {
    *resultCapacity = str.getCapacity() - oldLength;
    return str.getArrayStart() + oldLength;
  }
  *resultCapacity = scratchCapacity;
  return scratch;
}